

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  ZSTD_Sequence *pZVar1;
  BYTE *pBVar2;
  BYTE **ppBVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_CDict *pZVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  undefined8 uVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  U32 UVar11;
  uint uVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  U32 UVar18;
  ulong uVar19;
  repcodes_t updatedRepcodes;
  size_t local_60;
  
  uVar4 = seqPos->idx;
  pBVar17 = (BYTE *)(blockSize + (long)src);
  pZVar6 = cctx->cdict;
  if (pZVar6 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar6 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_001637f8;
    }
    local_60 = 0;
  }
  else {
LAB_001637f8:
    local_60 = (size_t)(uint)pZVar6->dictContentSize;
  }
  pZVar7 = (cctx->blockState).prevCBlock;
  updatedRepcodes.rep[2] = pZVar7->rep[2];
  uVar8 = *(undefined8 *)pZVar7->rep;
  updatedRepcodes.rep[0] = (U32)uVar8;
  updatedRepcodes.rep[1] = (U32)((ulong)uVar8 >> 0x20);
  uVar16 = (ulong)uVar4;
  while (UVar18 = updatedRepcodes.rep[1], uVar15 = (uint)uVar16, uVar16 < inSeqsSize) {
    pZVar1 = inSeqs + uVar16;
    uVar12 = inSeqs[uVar16].matchLength;
    if (((ulong)uVar12 == 0) && (pZVar1->offset == 0)) break;
    uVar5 = pZVar1->litLength;
    uVar16 = (ulong)uVar5;
    if (externalRepSearch == ZSTD_ps_disable) {
      if (pZVar1->offset == 0) {
        __assert_fail("(inSeqs[idx].offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x69cf,
                      "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      UVar18 = pZVar1->offset + 3;
    }
    else {
      UVar18 = ZSTD_finalizeOffBase(pZVar1->offset,updatedRepcodes.rep,(uint)(uVar16 == 0));
      ZSTD_updateRep(updatedRepcodes.rep,UVar18,(uint)(uVar16 == 0));
    }
    if ((cctx->appliedParams).validateSequences != 0) {
      sVar13 = (ulong)(uVar5 + uVar12) + seqPos->posInSrc;
      seqPos->posInSrc = sVar13;
      sVar13 = ZSTD_validateSequence
                         (UVar18,uVar12,(cctx->appliedParams).cParams.minMatch,sVar13,
                          (cctx->appliedParams).cParams.windowLog,local_60,
                          (cctx->appliedParams).useSequenceProducer);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
    }
    uVar19 = (cctx->seqStore).maxNbSeq;
    if (uVar19 <= uVar15 - seqPos->idx) {
      return 0xffffffffffffff95;
    }
    if (uVar19 <= (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart
                         >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar19 = (cctx->seqStore).maxNbLit;
    if (0x20000 < uVar19) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar9 = (cctx->seqStore).lit;
    if ((cctx->seqStore).litStart + uVar19 < pBVar9 + uVar16) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar2 = (BYTE *)((long)src + uVar16);
    if (pBVar17 < pBVar2) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar17 + -0x20 < pBVar2) {
      ZSTD_safecopyLiterals(pBVar9,(BYTE *)src,pBVar2,pBVar17 + -0x20);
LAB_0016399c:
      ppBVar3 = &(cctx->seqStore).lit;
      *ppBVar3 = *ppBVar3 + uVar16;
      if (0xffff < uVar5) {
        if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart)
                  >> 3);
      }
    }
    else {
      uVar8 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar9 = *src;
      *(undefined8 *)(pBVar9 + 8) = uVar8;
      if (0x10 < uVar5) {
        pBVar9 = (cctx->seqStore).lit;
        if ((BYTE *)0xffffffffffffffe0 < pBVar9 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar8 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar9 + 0x18) = uVar8;
        if (0x10 < uVar16 - 0x10) {
          lVar14 = 0;
          do {
            uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar14 + 0x20) + 8);
            pBVar2 = pBVar9 + lVar14 + 0x20;
            *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar14 + 0x20);
            *(undefined8 *)(pBVar2 + 8) = uVar8;
            uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar14 + 0x30) + 8);
            *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar14 + 0x30);
            *(undefined8 *)(pBVar2 + 0x18) = uVar8;
            lVar14 = lVar14 + 0x20;
          } while (pBVar2 + 0x20 < pBVar9 + uVar16);
          goto LAB_0016399c;
        }
      }
      ppBVar3 = &(cctx->seqStore).lit;
      *ppBVar3 = *ppBVar3 + uVar16;
    }
    psVar10 = (cctx->seqStore).sequences;
    psVar10->litLength = (U16)uVar5;
    psVar10->offBase = UVar18;
    if (uVar12 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar16 = (ulong)uVar12 - 3;
    if (0xffff < uVar16) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar10->mlBase = (U16)uVar16;
    (cctx->seqStore).sequences = psVar10 + 1;
    src = (void *)((long)src + (ulong)(uVar12 + uVar5));
    uVar16 = (ulong)(uVar15 + 1);
  }
  if (externalRepSearch == ZSTD_ps_auto) {
    __assert_fail("externalRepSearch != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x69e4,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  if (uVar15 < uVar4) {
    __assert_fail("idx >= startIdx",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x69e5,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  UVar11 = updatedRepcodes.rep[0];
  if ((externalRepSearch == ZSTD_ps_disable) && (uVar15 != uVar4)) {
    uVar12 = uVar15 - 1;
    if (uVar12 < uVar4 + 2) {
      if (uVar15 != uVar4 + 2) {
        if (uVar12 != uVar4) {
          __assert_fail("lastSeqIdx == startIdx",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x69f3,
                        "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        updatedRepcodes.rep[1] = updatedRepcodes.rep[0];
        updatedRepcodes.rep[2] = UVar18;
        UVar11 = inSeqs[uVar4].offset;
        goto LAB_00163b7c;
      }
    }
    else {
      updatedRepcodes.rep[0] = inSeqs[uVar15 - 3].offset;
    }
    updatedRepcodes.rep[1] = inSeqs[uVar15 - 2].offset;
    UVar11 = inSeqs[uVar12].offset;
    updatedRepcodes.rep[2] = updatedRepcodes.rep[0];
  }
LAB_00163b7c:
  updatedRepcodes.rep[0] = UVar11;
  pZVar7 = (cctx->blockState).nextCBlock;
  pZVar7->rep[2] = updatedRepcodes.rep[2];
  *(ulong *)pZVar7->rep = CONCAT44(updatedRepcodes.rep[1],updatedRepcodes.rep[0]);
  uVar19 = (ulong)inSeqs[uVar16].litLength;
  if (uVar19 != 0) {
    memcpy((cctx->seqStore).lit,src,uVar19);
    ppBVar3 = &(cctx->seqStore).lit;
    *ppBVar3 = *ppBVar3 + uVar19;
    src = (void *)((long)src + (ulong)inSeqs[uVar16].litLength);
    seqPos->posInSrc = seqPos->posInSrc + (ulong)inSeqs[uVar16].litLength;
  }
  sVar13 = 0xffffffffffffff95;
  if ((BYTE *)src == pBVar17) {
    seqPos->idx = uVar15 + 1;
    sVar13 = 0;
  }
  return sVar13;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}